

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall
crypto_tests::chacha20poly1305_testvectors::test_method(chacha20poly1305_testvectors *this)

{
  long in_FS_OFFSET;
  undefined1 in_stack_00000118 [16];
  string *in_stack_00000220;
  long *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int *in_stack_fffffffffffffb60;
  pair<unsigned_int,_unsigned_long> *in_stack_fffffffffffffb68;
  allocator<char> *in_stack_fffffffffffffb98;
  allocator<char> *__a;
  char *in_stack_fffffffffffffba0;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  allocator<char> local_3b1;
  allocator<char> local_3b0;
  allocator<char> local_3af;
  allocator<char> local_3ae;
  allocator<char> local_3ad;
  allocator<char> local_3ac;
  allocator<char> local_3ab;
  allocator<char> local_3aa;
  allocator<char> local_3a9;
  undefined8 local_3a8;
  undefined4 local_39c;
  undefined8 in_stack_fffffffffffffc68;
  uint64_t in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffc78;
  string *aad_hex;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 uVar2;
  CryptoTest *in_stack_fffffffffffffc90;
  allocator<char> local_35c;
  allocator<char> local_35b;
  allocator<char> local_35a;
  allocator<char> local_359;
  string *in_stack_fffffffffffffca8;
  string *key_hex;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  undefined4 uVar3;
  string *in_stack_fffffffffffffcb8;
  CryptoTest *in_stack_fffffffffffffcc0;
  allocator<char> local_334;
  allocator<char> local_333;
  allocator<char> local_332;
  allocator<char> local_331;
  undefined8 local_330;
  undefined4 local_324;
  allocator<char> local_30b;
  allocator<char> local_30a;
  allocator<char> local_309 [257];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_324 = 7;
  local_330 = 0x4746454443424140;
  std::pair<unsigned_int,_unsigned_long>::pair<int,_long,_true>
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  pbVar1 = local_88;
  CryptoTest::TestChaCha20Poly1305
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             (string *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
             in_stack_fffffffffffffca8,(Nonce96)in_stack_00000118,in_stack_00000220);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(&local_30b);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(&local_30a);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  uVar3 = 0;
  key_hex = (string *)0x807060504030201;
  std::pair<unsigned_int,_unsigned_long>::pair<int,_long,_true>
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,(long *)pbVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  pbVar1 = local_108;
  CryptoTest::TestChaCha20Poly1305
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             (string *)CONCAT44(uVar3,in_stack_fffffffffffffcb0),key_hex,(Nonce96)in_stack_00000118,
             in_stack_00000220);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(&local_359);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(&local_334);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(&local_333);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(&local_332);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  uVar2 = 0x3432b75f;
  aad_hex = (string *)0xb3585537eb7f4024;
  std::pair<unsigned_int,_unsigned_long>::pair<int,_unsigned_long,_true>
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,(unsigned_long *)pbVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  pbVar1 = local_188;
  CryptoTest::TestChaCha20Poly1305
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             (string *)CONCAT44(uVar3,in_stack_fffffffffffffcb0),key_hex,(Nonce96)in_stack_00000118,
             in_stack_00000220);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc7f);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(&local_35c);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(&local_35b);
  std::__cxx11::string::~string(pbVar1);
  std::allocator<char>::~allocator(&local_35a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_39c = 0x1f90da88;
  local_3a8 = 0x75dafa3ef84471a4;
  std::pair<unsigned_int,_unsigned_long>::pair<int,_long,_true>
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,(long *)pbVar1);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar1,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  this_00 = local_208;
  CryptoTest::TestChaCha20Poly1305
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             (string *)CONCAT44(uVar3,in_stack_fffffffffffffcb0),key_hex,(Nonce96)in_stack_00000118,
             in_stack_00000220);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc7c);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc7d);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc7e);
  __s = &local_3aa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)__s,in_stack_fffffffffffffb98);
  __a = &local_3ab;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)__s,__a);
  CryptoTest::TestFSChaCha20Poly1305
            (in_stack_fffffffffffffc90,(string *)CONCAT44(uVar2,in_stack_fffffffffffffc88),aad_hex,
             in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68
            );
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_3ad);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_3ac);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_3ab);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_3aa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)__s,__a);
  CryptoTest::TestFSChaCha20Poly1305
            (in_stack_fffffffffffffc90,(string *)CONCAT44(uVar2,in_stack_fffffffffffffc88),aad_hex,
             in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68
            );
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_3b0);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_3af);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_3ae);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(chacha20poly1305_testvectors)
{
    // Note that in our implementation, the authentication is suffixed to the ciphertext.
    // The RFC test vectors specify them separately.

    // RFC 8439 Example from section 2.8.2
    TestChaCha20Poly1305("4c616469657320616e642047656e746c656d656e206f662074686520636c6173"
                         "73206f66202739393a204966204920636f756c64206f6666657220796f75206f"
                         "6e6c79206f6e652074697020666f7220746865206675747572652c2073756e73"
                         "637265656e20776f756c642062652069742e",
                         "50515253c0c1c2c3c4c5c6c7",
                         "808182838485868788898a8b8c8d8e8f909192939495969798999a9b9c9d9e9f",
                         {7, 0x4746454443424140},
                         "d31a8d34648e60db7b86afbc53ef7ec2a4aded51296e08fea9e2b5a736ee62d6"
                         "3dbea45e8ca9671282fafb69da92728b1a71de0a9e060b2905d6a5b67ecd3b36"
                         "92ddbd7f2d778b8c9803aee328091b58fab324e4fad675945585808b4831d7bc"
                         "3ff4def08e4b7a9de576d26586cec64b61161ae10b594f09e26a7e902ecbd060"
                         "0691");

    // RFC 8439 Test vector A.5
    TestChaCha20Poly1305("496e7465726e65742d4472616674732061726520647261667420646f63756d65"
                         "6e74732076616c696420666f722061206d6178696d756d206f6620736978206d"
                         "6f6e74687320616e64206d617920626520757064617465642c207265706c6163"
                         "65642c206f72206f62736f6c65746564206279206f7468657220646f63756d65"
                         "6e747320617420616e792074696d652e20497420697320696e617070726f7072"
                         "6961746520746f2075736520496e7465726e65742d4472616674732061732072"
                         "65666572656e6365206d6174657269616c206f7220746f206369746520746865"
                         "6d206f74686572207468616e206173202fe2809c776f726b20696e2070726f67"
                         "726573732e2fe2809d",
                         "f33388860000000000004e91",
                         "1c9240a5eb55d38af333888604f6b5f0473917c1402b80099dca5cbc207075c0",
                         {0, 0x0807060504030201},
                         "64a0861575861af460f062c79be643bd5e805cfd345cf389f108670ac76c8cb2"
                         "4c6cfc18755d43eea09ee94e382d26b0bdb7b73c321b0100d4f03b7f355894cf"
                         "332f830e710b97ce98c8a84abd0b948114ad176e008d33bd60f982b1ff37c855"
                         "9797a06ef4f0ef61c186324e2b3506383606907b6a7c02b0f9f6157b53c867e4"
                         "b9166c767b804d46a59b5216cde7a4e99040c5a40433225ee282a1b0a06c523e"
                         "af4534d7f83fa1155b0047718cbc546a0d072b04b3564eea1b422273f548271a"
                         "0bb2316053fa76991955ebd63159434ecebb4e466dae5a1073a6727627097a10"
                         "49e617d91d361094fa68f0ff77987130305beaba2eda04df997b714d6c6f2c29"
                         "a6ad5cb4022b02709beead9d67890cbb22392336fea1851f38");

    // Test vectors exercising aad and plaintext which are multiples of 16 bytes.
    TestChaCha20Poly1305("8d2d6a8befd9716fab35819eaac83b33269afb9f1a00fddf66095a6c0cd91951"
                         "a6b7ad3db580be0674c3f0b55f618e34",
                         "",
                         "72ddc73f07101282bbbcf853b9012a9f9695fc5d36b303a97fd0845d0314e0c3",
                         {0x3432b75f, 0xb3585537eb7f4024},
                         "f760b8224fb2a317b1b07875092606131232a5b86ae142df5df1c846a7f6341a"
                         "f2564483dd77f836be45e6230808ffe402a6f0a3e8be074b3d1f4ea8a7b09451");
    TestChaCha20Poly1305("",
                         "36970d8a704c065de16250c18033de5a400520ac1b5842b24551e5823a3314f3"
                         "946285171e04a81ebfbe3566e312e74ab80e94c7dd2ff4e10de0098a58d0f503",
                         "77adda51d6730b9ad6c995658cbd49f581b2547e7c0c08fcc24ceec797461021",
                         {0x1f90da88, 0x75dafa3ef84471a4},
                         "aaae5bb81e8407c94b2ae86ae0c7efbe");

    // FSChaCha20Poly1305 tests.
    TestFSChaCha20Poly1305("d6a4cb04ef0f7c09c1866ed29dc24d820e75b0491032a51b4c3366f9ca35c19e"
                           "a3047ec6be9d45f9637b63e1cf9eb4c2523a5aab7b851ebeba87199db0e839cf"
                           "0d5c25e50168306377aedbe9089fd2463ded88b83211cf51b73b150608cc7a60"
                           "0d0f11b9a742948482e1b109d8faf15b450aa7322e892fa2208c6691e3fecf4c"
                           "711191b14d75a72147",
                           "786cb9b6ebf44288974cf0",
                           "5c9e1c3951a74fba66708bf9d2c217571684556b6a6a3573bff2847d38612654",
                           500,
                           "9dcebbd3281ea3dd8e9a1ef7d55a97abd6743e56ebc0c190cb2c4e14160b385e"
                           "0bf508dddf754bd02c7c208447c131ce23e47a4a14dfaf5dd8bc601323950f75"
                           "4e05d46e9232f83fc5120fbbef6f5347a826ec79a93820718d4ec7a2b7cfaaa4"
                           "4b21e16d726448b62f803811aff4f6d827ed78e738ce8a507b81a8ae13131192"
                           "8039213de18a5120dc9b7370baca878f50ff254418de3da50c");
    TestFSChaCha20Poly1305("8349b7a2690b63d01204800c288ff1138a1d473c832c90ea8b3fc102d0bb3adc"
                           "44261b247c7c3d6760bfbe979d061c305f46d94c0582ac3099f0bf249f8cb234",
                           "",
                           "3bd2093fcbcb0d034d8c569583c5425c1a53171ea299f8cc3bbf9ae3530adfce",
                           60000,
                           "30a6757ff8439b975363f166a0fa0e36722ab35936abd704297948f45083f4d4"
                           "99433137ce931f7fca28a0acd3bc30f57b550acbc21cbd45bbef0739d9caf30c"
                           "14b94829deb27f0b1923a2af704ae5d6");
}